

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printUnaryPrefix(JSPrinter *this,Ref node)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  Ref *pRVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  Ref local_28;
  Ref node_local;
  
  local_28.inst = node.inst;
  if (this->finalize == true) {
    pRVar4 = Ref::operator[](&local_28,1);
    bVar2 = Ref::operator==(pRVar4,(IString *)&PLUS);
    if (bVar2) {
      pRVar4 = Ref::operator[](&local_28,2);
      if (pRVar4->inst->type == Number) {
LAB_00d44700:
        iVar1 = (int)this->used;
        pRVar4 = Ref::operator[](&local_28,2);
        print(this,pRVar4->inst);
        ensure(this,1);
        pcVar7 = this->buffer;
        pcVar7[this->used] = '\0';
        pcVar7 = pcVar7 + iVar1;
        pcVar5 = strstr(pcVar7,"Infinity");
        if (pcVar5 != (char *)0x0) {
          return;
        }
        pcVar5 = strstr(pcVar7,"NaN");
        if (pcVar5 != (char *)0x0) {
          return;
        }
        pcVar5 = strchr(pcVar7,0x2e);
        if (pcVar5 != (char *)0x0) {
          return;
        }
        pcVar7 = strchr(pcVar7,0x65);
        if (pcVar7 != (char *)0x0) {
          ensure(this,3);
          pcVar5 = this->buffer;
          sVar6 = strlen(pcVar5 + iVar1);
          for (pcVar5 = pcVar5 + iVar1 + sVar6; pcVar7 <= pcVar5; pcVar5 = pcVar5 + -1) {
            pcVar5[2] = *pcVar5;
          }
          pcVar7[0] = '.';
          pcVar7[1] = '0';
          this->used = this->used + 2;
          return;
        }
        emit(this,".0");
        return;
      }
      pRVar4 = Ref::operator[](&local_28,2);
      if (pRVar4->inst->type == Array) {
        pRVar4 = Ref::operator[](&local_28,2);
        pRVar4 = Ref::operator[](pRVar4,0);
        bVar2 = Ref::operator==(pRVar4,(IString *)UNARY_PREFIX);
        if (bVar2) {
          pRVar4 = Ref::operator[](&local_28,2);
          pRVar4 = Ref::operator[](pRVar4,1);
          bVar2 = Ref::operator==(pRVar4,(IString *)&MINUS);
          if (bVar2) {
            pRVar4 = Ref::operator[](&local_28,2);
            pRVar4 = Ref::operator[](pRVar4,2);
            if (pRVar4->inst->type == Number) goto LAB_00d44700;
          }
        }
      }
    }
  }
  cVar3 = this->buffer[this->used - 1];
  if (cVar3 == '-') {
    pRVar4 = Ref::operator[](&local_28,1);
    bVar2 = Ref::operator==(pRVar4,(IString *)&MINUS);
    if (!bVar2) {
      cVar3 = this->buffer[this->used - 1];
      goto LAB_00d44887;
    }
  }
  else {
LAB_00d44887:
    if (cVar3 != '+') goto LAB_00d448b5;
    pRVar4 = Ref::operator[](&local_28,1);
    bVar2 = Ref::operator==(pRVar4,(IString *)&PLUS);
    if (!bVar2) goto LAB_00d448b5;
  }
  emit(this,' ');
LAB_00d448b5:
  pRVar4 = Ref::operator[](&local_28,1);
  pcVar7 = cashew::Value::getCString(pRVar4->inst);
  emit(this,pcVar7);
  pRVar4 = Ref::operator[](&local_28,2);
  printChild(this,pRVar4->inst,local_28,1);
  return;
}

Assistant:

void printUnaryPrefix(Ref node) {
    if (finalize && node[1] == PLUS &&
        (node[2]->isNumber() ||
         (node[2]->isArray() && node[2][0] == UNARY_PREFIX &&
          node[2][1] == MINUS && node[2][2]->isNumber()))) {
      // emit a finalized number
      int last = used;
      print(node[2]);
      ensure(1);                  // we temporarily append a 0
      char* curr = buffer + last; // ensure might invalidate
      buffer[used] = 0;
      if (strstr(curr, "Infinity")) {
        return;
      }
      if (strstr(curr, "NaN")) {
        return;
      }
      if (strchr(curr, '.')) {
        return; // already a decimal point, all good
      }
      char* e = strchr(curr, 'e');
      if (!e) {
        emit(".0");
        return;
      }
      ensure(3);
      curr = buffer + last; // ensure might invalidate
      char* end = strchr(curr, 0);
      while (end >= e) {
        end[2] = end[0];
        end--;
      }
      e[0] = '.';
      e[1] = '0';
      used += 2;
      return;
    }
    if ((buffer[used - 1] == '-' && node[1] == MINUS) ||
        (buffer[used - 1] == '+' && node[1] == PLUS)) {
      emit(' '); // cannot join - and - to --, looks like the -- operator
    }
    emit(node[1]->getCString());
    printChild(node[2], node, 1);
  }